

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O0

bool cmQtAutoGen::RccListParseOutput
               (string *rccStdOut,string *rccStdErr,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,string *error)

{
  bool bVar1;
  int iVar2;
  istream *piVar3;
  ulong uVar4;
  long lVar5;
  value_type local_3e8;
  long local_3c8;
  size_type sz;
  string local_3b8;
  ulong local_398;
  size_type pos;
  undefined1 local_388 [8];
  string eline;
  istringstream estr;
  undefined1 local_1d8 [8];
  string oline;
  istringstream ostr;
  anon_class_1_0_00000001 local_31;
  string *psStack_30;
  anon_class_1_0_00000001 StripCR;
  string *error_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *rccStdErr_local;
  string *rccStdOut_local;
  
  psStack_30 = error;
  std::__cxx11::istringstream::istringstream
            ((istringstream *)(oline.field_2._M_local_buf + 8),(string *)rccStdOut,_S_in);
  std::__cxx11::string::string((string *)local_1d8);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)(oline.field_2._M_local_buf + 8),(string *)local_1d8);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    RccListParseOutput::anon_class_1_0_00000001::operator()(&local_31,(string *)local_1d8);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(files,(value_type *)local_1d8);
    }
  }
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::istringstream::~istringstream((istringstream *)(oline.field_2._M_local_buf + 8));
  std::__cxx11::istringstream::istringstream
            ((istringstream *)(eline.field_2._M_local_buf + 8),(string *)rccStdErr,_S_in);
  std::__cxx11::string::string((string *)local_388);
  do {
    do {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)(eline.field_2._M_local_buf + 8),(string *)local_388);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar1) {
        sz._4_4_ = 0;
LAB_005f82de:
        std::__cxx11::string::~string((string *)local_388);
        std::__cxx11::istringstream::~istringstream
                  ((istringstream *)(eline.field_2._M_local_buf + 8));
        if (sz._4_4_ == 0) {
          rccStdOut_local._7_1_ = 1;
        }
        return (bool)(rccStdOut_local._7_1_ & 1);
      }
      RccListParseOutput::anon_class_1_0_00000001::operator()(&local_31,(string *)local_388);
      bVar1 = cmHasLiteralPrefix<std::__cxx11::string,14ul>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_388,(char (*) [14])"RCC: Error in");
    } while (!bVar1);
    if ((RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
         ::searchString_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                                     ::searchString_abi_cxx11_), iVar2 != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 &RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                  ::searchString_abi_cxx11_,"Cannot find file \'",
                 (allocator<char> *)((long)&pos + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
      __cxa_atexit(std::__cxx11::string::~string,
                   &RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                    ::searchString_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&RccListParseOutput(std::__cxx11::string_const&,std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::__cxx11::string&)
                           ::searchString_abi_cxx11_);
    }
    local_398 = std::__cxx11::string::find((string *)local_388,0xa9b0b8);
    if (local_398 == 0xffffffffffffffff) {
      std::__cxx11::string::operator=((string *)psStack_30,"rcc lists unparsable output:\n");
      Quoted(&local_3b8,(string *)local_388);
      std::__cxx11::string::operator+=((string *)psStack_30,(string *)&local_3b8);
      std::__cxx11::string::~string((string *)&local_3b8);
      std::__cxx11::string::operator+=((string *)psStack_30,"\n");
      rccStdOut_local._7_1_ = 0;
      sz._4_4_ = 1;
      goto LAB_005f82de;
    }
    lVar5 = std::__cxx11::string::length();
    local_398 = local_398 + lVar5;
    local_3c8 = std::__cxx11::string::size();
    local_3c8 = ~local_398 + local_3c8;
    std::__cxx11::string::substr((ulong)&local_3e8,(ulong)local_388);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(files,&local_3e8);
    std::__cxx11::string::~string((string *)&local_3e8);
  } while( true );
}

Assistant:

bool cmQtAutoGen::RccListParseOutput(std::string const& rccStdOut,
                                     std::string const& rccStdErr,
                                     std::vector<std::string>& files,
                                     std::string& error)
{
  // Lambda to strip CR characters
  auto StripCR = [](std::string& line) {
    std::string::size_type cr = line.find('\r');
    if (cr != std::string::npos) {
      line = line.substr(0, cr);
    }
  };

  // Parse rcc std output
  {
    std::istringstream ostr(rccStdOut);
    std::string oline;
    while (std::getline(ostr, oline)) {
      StripCR(oline);
      if (!oline.empty()) {
        files.push_back(oline);
      }
    }
  }
  // Parse rcc error output
  {
    std::istringstream estr(rccStdErr);
    std::string eline;
    while (std::getline(estr, eline)) {
      StripCR(eline);
      if (cmHasLiteralPrefix(eline, "RCC: Error in")) {
        static std::string const searchString = "Cannot find file '";

        std::string::size_type pos = eline.find(searchString);
        if (pos == std::string::npos) {
          error = "rcc lists unparsable output:\n";
          error += cmQtAutoGen::Quoted(eline);
          error += "\n";
          return false;
        }
        pos += searchString.length();
        std::string::size_type sz = eline.size() - pos - 1;
        files.push_back(eline.substr(pos, sz));
      }
    }
  }

  return true;
}